

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

int __thiscall
notch::core::SharedBuffers::clone
          (SharedBuffers *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  valarray<float> *pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  valarray<float> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (*(valarray<float> **)__fn != (valarray<float> *)0x0) {
    local_28 = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::valarray<float>,std::allocator<std::valarray<float>>,std::valarray<float>&>
              (a_Stack_20,&local_28,(allocator<std::valarray<float>_> *)&local_29,
               *(valarray<float> **)__fn);
    _Var3._M_pi = a_Stack_20[0]._M_pi;
    pvVar2 = local_28;
    local_28 = (valarray<float> *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->inputBuffer).
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pvVar2;
    (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  if (*(valarray<float> **)(__fn + 0x10) != (valarray<float> *)0x0) {
    local_28 = (element_type *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::valarray<float>,std::allocator<std::valarray<float>>,std::valarray<float>&>
              (a_Stack_20,&local_28,(allocator<std::valarray<float>_> *)&local_29,
               *(valarray<float> **)(__fn + 0x10));
    _Var3._M_pi = a_Stack_20[0]._M_pi;
    pvVar2 = local_28;
    local_28 = (valarray<float> *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->outputBuffer).
             super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = pvVar2;
    (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return (int)this;
}

Assistant:

SharedBuffers clone() const {
        SharedBuffers newBuffers;
        if (inputBuffer) {
            newBuffers.inputBuffer = std::make_shared<Array>(*inputBuffer);
        }
        if (outputBuffer) {
            newBuffers.outputBuffer = std::make_shared<Array>(*outputBuffer);
        }
        return newBuffers;
    }